

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTimeConstraint.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4894b::TestTimeConstraintFailsWithSlowTest::RunImpl
          (TestTimeConstraintFailsWithSlowTest *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  ScopedCurrentTest scopedResult;
  TimeConstraint t;
  TestDetails local_40;
  TestResults result;
  
  UnitTest::TestResults::TestResults(&result,(TestReporter *)0x0);
  ScopedCurrentTest::ScopedCurrentTest(&scopedResult,&result,(TestDetails *)0x0);
  UnitTest::TestDetails::TestDetails(&local_40,"","","",0);
  UnitTest::TimeConstraint::TimeConstraint(&t,10,&local_40);
  UnitTest::TimeHelpers::SleepMs(0x14);
  UnitTest::TimeConstraint::~TimeConstraint(&t);
  ScopedCurrentTest::~ScopedCurrentTest(&scopedResult);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  local_40.suiteName._0_4_ = 1;
  scopedResult.m_oldTestResults._0_4_ = UnitTest::TestResults::GetFailureCount(&result);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&t,*ppTVar2,0x1f);
  UnitTest::CheckEqual<int,int>(results,(int *)&local_40,(int *)&scopedResult,(TestDetails *)&t);
  return;
}

Assistant:

TEST(TimeConstraintFailsWithSlowTest)
{
    TestResults result;
    {
		ScopedCurrentTest scopedResult(result);
        TimeConstraint t(10, TestDetails("", "", "", 0));
        TimeHelpers::SleepMs(20);
    }
    CHECK_EQUAL(1, result.GetFailureCount());
}